

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

void __thiscall
TTD::EventLog::RecordJsRTInstanceOf
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,Var object,Var constructor)

{
  EventLogEntry *pEVar1;
  JsRTVarsArgumentAction_InternalUse<2UL> *local_30;
  JsRTDoubleVarArgumentAction *gpAction;
  
  local_30 = (JsRTVarsArgumentAction_InternalUse<2UL> *)0x0;
  pEVar1 = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<2ul>,(TTD::NSLogEvents::EventKind)46>
                     (this,&local_30);
  local_30->VarArray[0] = object;
  local_30->VarArray[1] = constructor;
  if (actionPopper->m_actionEvent == (EventLogEntry *)0x0) {
    actionPopper->m_actionEvent = pEVar1;
    return;
  }
  TTDAbort_unrecoverable_error("Don\'t double initialize");
}

Assistant:

void EventLog::RecordJsRTInstanceOf(TTDJsRTActionResultAutoRecorder& actionPopper, Js::Var object, Js::Var constructor)
    {
        NSLogEvents::JsRTDoubleVarArgumentAction* gpAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTDoubleVarArgumentAction, NSLogEvents::EventKind::InstanceOfActionTag>(&gpAction);
        NSLogEvents::SetVarItem_0(gpAction, TTD_CONVERT_JSVAR_TO_TTDVAR(object));
        NSLogEvents::SetVarItem_1(gpAction, TTD_CONVERT_JSVAR_TO_TTDVAR(constructor));

        actionPopper.InitializeWithEventAndEnter(evt);
    }